

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.cpp
# Opt level: O2

void __thiscall Logger::Logger(Logger *this,char *fileName,int line)

{
  Impl::Impl(&this->impl_,fileName,line);
  return;
}

Assistant:

Logger::Logger(const char *fileName, int line)
  : impl_(fileName, line)
{  
    //printf("Class Logger num:%d Created!\n",++ClassNum_);
}